

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O3

void __thiscall AstWalker::visitExpressionAstNode(AstWalker *this,ExpressionAstNode *node)

{
  long lVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar2;
  string local_38;
  
  if (node != (ExpressionAstNode *)0x0) {
    lVar1 = __dynamic_cast(node,&ExpressionAstNode::typeinfo,&LiteralExpressionAstNode::typeinfo,0);
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(node,&ExpressionAstNode::typeinfo,
                             &IdentifierExpressionAstNode::typeinfo,0);
      if (lVar1 == 0) {
        lVar1 = __dynamic_cast(node,&ExpressionAstNode::typeinfo,
                               &FunctionInvocationExpressionAstNode::typeinfo,0);
        if (lVar1 == 0) {
          lVar1 = __dynamic_cast(node,&ExpressionAstNode::typeinfo,
                                 &FunctionDeclarationExpressionAstNode::typeinfo,0);
          if (lVar1 == 0) {
            lVar1 = __dynamic_cast(node,&ExpressionAstNode::typeinfo,
                                   &ObjectDeclarationExpressionAstNode::typeinfo,0);
            if (lVar1 == 0) {
              lVar1 = __dynamic_cast(node,&ExpressionAstNode::typeinfo,
                                     &BuiltInFunctionInvocationExpressionAstNode::typeinfo,0);
              if (lVar1 == 0) goto LAB_00109df8;
              UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0xf];
              uVar2 = extraout_RDX_04;
            }
            else {
              UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0x11];
              uVar2 = extraout_RDX_03;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0x10];
            uVar2 = extraout_RDX_02;
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0xe];
          uVar2 = extraout_RDX_01;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0xd];
        uVar2 = extraout_RDX_00;
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0xc];
      uVar2 = extraout_RDX;
    }
    (*UNRECOVERED_JUMPTABLE)(this,lVar1,uVar2,UNRECOVERED_JUMPTABLE);
    return;
  }
LAB_00109df8:
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"visitExpressionAstNode called with unexpected node type","");
  Error::assertWithPanic(false,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AstWalker::visitExpressionAstNode(ExpressionAstNode* node) noexcept {

  auto literal = dynamic_cast<LiteralExpressionAstNode*>(node);
  if (literal != nullptr) {
    this->visitLiteralExpressionAstNode(literal);
    return;
  }

  auto identifier = dynamic_cast<IdentifierExpressionAstNode*>(node);
  if (identifier != nullptr) {
    this->visitIdentifierExpressionAstNode(identifier);
    return;
  }

  auto fnCall = dynamic_cast<FunctionInvocationExpressionAstNode*>(node);
  if (fnCall != nullptr) {
    this->visitFunctionInvocationExpressionAstNode(fnCall);
    return;
  }

  auto fnDefine = dynamic_cast<FunctionDeclarationExpressionAstNode*>(node);
  if (fnDefine != nullptr) {
    this->visitFunctionDeclarationExpressionAstNode(fnDefine);
    return;
  }

  auto objDef = dynamic_cast<ObjectDeclarationExpressionAstNode*>(node);
  if (objDef != nullptr) {
    this->visitObjectDeclarationExpressionAstNode(objDef);
    return;
  }

  auto builtInFn = dynamic_cast<BuiltInFunctionInvocationExpressionAstNode*>(node);
  if (builtInFn != nullptr) {
    this->visitBuiltInFunctionInvocationExpressionAstNode(builtInFn);
    return;
  }

  Error::assertWithPanic(false, "visitExpressionAstNode called with unexpected node type");
}